

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowCustomAggregatorGlobalState::WindowCustomAggregatorGlobalState
          (WindowCustomAggregatorGlobalState *this,ClientContext *context,
          WindowCustomAggregator *aggregator,idx_t group_count)

{
  _Head_base<0UL,_duckdb::WindowCustomAggregatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::WindowCustomAggregatorState_*,_false> this_00;
  
  WindowAggregatorGlobalState::WindowAggregatorGlobalState
            (&this->super_WindowAggregatorGlobalState,context,&aggregator->super_WindowAggregator,
             group_count);
  (this->super_WindowAggregatorGlobalState).super_WindowAggregatorState._vptr_WindowAggregatorState
       = (_func_int **)&PTR__WindowCustomAggregatorGlobalState_0243fda8;
  this->context = context;
  (this->filter_packed).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->filter_packed).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->filter_packed).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filter_packed).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  (this->gcstate).
  super_unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCustomAggregatorState_*,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowCustomAggregatorState_*,_false>._M_head_impl =
       (WindowCustomAggregatorState *)0x0;
  (this->partition_input).
  super_unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowPartitionInput_*,_std::default_delete<duckdb::WindowPartitionInput>_>
  .super__Head_base<0UL,_duckdb::WindowPartitionInput_*,_false>._M_head_impl =
       (WindowPartitionInput *)0x0;
  this_00._M_head_impl = (WindowCustomAggregatorState *)operator_new(0x250);
  WindowCustomAggregatorState::WindowCustomAggregatorState
            (this_00._M_head_impl,&(this->super_WindowAggregatorGlobalState).aggr,
             (aggregator->super_WindowAggregator).exclude_mode);
  _Var1._M_head_impl =
       (this->gcstate).
       super_unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowCustomAggregatorState_*,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
       .super__Head_base<0UL,_duckdb::WindowCustomAggregatorState_*,_false>._M_head_impl;
  (this->gcstate).
  super_unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCustomAggregatorState_*,_std::default_delete<duckdb::WindowCustomAggregatorState>_>
  .super__Head_base<0UL,_duckdb::WindowCustomAggregatorState_*,_false>._M_head_impl =
       this_00._M_head_impl;
  if (_Var1._M_head_impl != (WindowCustomAggregatorState *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WindowAggregatorLocalState + 8))();
    return;
  }
  return;
}

Assistant:

explicit WindowCustomAggregatorGlobalState(ClientContext &context, const WindowCustomAggregator &aggregator,
	                                           idx_t group_count)
	    : WindowAggregatorGlobalState(context, aggregator, group_count), context(context) {

		gcstate = make_uniq<WindowCustomAggregatorState>(aggr, aggregator.exclude_mode);
	}